

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

TString * internshrstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  global_State *pgVar2;
  int iVar3;
  size_t sVar4;
  TString *pTVar5;
  uint uVar6;
  int iVar7;
  TString **ppTVar8;
  uint uVar9;
  
  pgVar2 = L->l_G;
  uVar9 = pgVar2->seed ^ (uint)l;
  sVar4 = l;
  if (l != 0) {
    do {
      uVar9 = uVar9 ^ (uint)(byte)str[sVar4 - 1] + (uVar9 >> 2) + uVar9 * 0x20;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  ppTVar8 = (pgVar2->strt).hash;
  iVar7 = (pgVar2->strt).size;
  uVar6 = iVar7 - 1U & uVar9;
  pTVar5 = ppTVar8[uVar6];
  while( true ) {
    if (pTVar5 == (TString *)0x0) {
      iVar3 = (pgVar2->strt).nuse;
      if (iVar3 < iVar7) {
        ppTVar8 = ppTVar8 + uVar6;
      }
      else {
        if (iVar3 == 0x7fffffff) {
          luaC_fullgc(L,1);
          if ((pgVar2->strt).nuse == 0x7fffffff) {
            luaD_throw(L,'\x04');
          }
          iVar7 = (pgVar2->strt).size;
        }
        if (iVar7 < 0x40000000) {
          luaS_resize(L,iVar7 * 2);
          iVar7 = (pgVar2->strt).size;
        }
        ppTVar8 = (pgVar2->strt).hash + (iVar7 - 1U & uVar9);
      }
      pTVar5 = (TString *)luaC_newobj(L,'\x04',l + 0x19);
      pTVar5->hash = uVar9;
      pTVar5->extra = '\0';
      pTVar5->shrlen = (ls_byte)l;
      *(undefined1 *)((long)&pTVar5->contents + l) = 0;
      memcpy(&pTVar5->contents,str,l);
      (pTVar5->u).hnext = *ppTVar8;
      *ppTVar8 = pTVar5;
      piVar1 = &(pgVar2->strt).nuse;
      *piVar1 = *piVar1 + 1;
      return pTVar5;
    }
    if (((uint)(int)pTVar5->shrlen == l) && (iVar3 = bcmp(str,&pTVar5->contents,l), iVar3 == 0))
    break;
    pTVar5 = (pTVar5->u).hnext;
  }
  if (((pgVar2->currentwhite ^ 0x18) & pTVar5->marked) == 0) {
    return pTVar5;
  }
  pTVar5->marked = pTVar5->marked ^ 0x18;
  return pTVar5;
}

Assistant:

static TString *internshrstr (lua_State *L, const char *str, size_t l) {
  TString *ts;
  global_State *g = G(L);
  stringtable *tb = &g->strt;
  unsigned int h = luaS_hash(str, l, g->seed);
  TString **list = &tb->hash[lmod(h, tb->size)];
  lua_assert(str != NULL);  /* otherwise 'memcmp'/'memcpy' are undefined */
  for (ts = *list; ts != NULL; ts = ts->u.hnext) {
    if (l == cast_uint(ts->shrlen) &&
        (memcmp(str, getshrstr(ts), l * sizeof(char)) == 0)) {
      /* found! */
      if (isdead(g, ts))  /* dead (but not collected yet)? */
        changewhite(ts);  /* resurrect it */
      return ts;
    }
  }
  /* else must create a new string */
  if (tb->nuse >= tb->size) {  /* need to grow string table? */
    growstrtab(L, tb);
    list = &tb->hash[lmod(h, tb->size)];  /* rehash with new size */
  }
  ts = createstrobj(L, sizestrshr(l), LUA_VSHRSTR, h);
  ts->shrlen = cast(ls_byte, l);
  getshrstr(ts)[l] = '\0';  /* ending 0 */
  memcpy(getshrstr(ts), str, l * sizeof(char));
  ts->u.hnext = *list;
  *list = ts;
  tb->nuse++;
  return ts;
}